

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

CopyLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_copy(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 600) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 600;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    CopyLayerParams::CopyLayerParams(this_00.copy_);
    (this->layer_).copy_ = (CopyLayerParams *)this_00;
  }
  return (CopyLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::CopyLayerParams* NeuralNetworkLayer::mutable_copy() {
  if (!has_copy()) {
    clear_layer();
    set_has_copy();
    layer_.copy_ = new ::CoreML::Specification::CopyLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.copy)
  return layer_.copy_;
}